

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  uchar uVar1;
  uchar *puVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  cJSON_bool cVar7;
  cJSON *pcVar8;
  ulong uVar9;
  long lVar10;
  cJSON *item_00;
  byte bVar11;
  uint uVar12;
  cJSON *pcVar13;
  cJSON *pcVar14;
  long in_FS_OFFSET;
  double dVar15;
  uchar *after_end;
  byte local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar7 = 0;
  if ((input_buffer != (parse_buffer *)0x0) &&
     (puVar2 = input_buffer->content, puVar2 != (uchar *)0x0)) {
    uVar3 = input_buffer->length;
    uVar4 = input_buffer->offset;
    uVar9 = uVar4 + 4;
    if ((uVar3 < uVar9) || (iVar6 = strncmp((char *)(puVar2 + uVar4),"null",4), iVar6 != 0)) {
      if ((uVar3 < uVar4 + 5) || (iVar6 = strncmp((char *)(puVar2 + uVar4),"false",5), iVar6 != 0))
      {
        if ((uVar3 < uVar9) || (iVar6 = strncmp((char *)(puVar2 + uVar4),"true",4), iVar6 != 0)) {
          if (uVar4 < uVar3) {
            uVar1 = puVar2[uVar4];
            if (uVar1 == '\"') {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                cVar7 = parse_string(item,input_buffer);
                return cVar7;
              }
              goto LAB_00103baf;
            }
            if (uVar1 == '-' || (byte)(uVar1 - 0x30) < 10) {
              after_end = (uchar *)0x0;
              bVar5 = get_decimal_point();
              puVar2 = input_buffer->content;
              if (puVar2 != (uchar *)0x0) {
                for (lVar10 = 0;
                    (lVar10 != 0x3f && (lVar10 + input_buffer->offset < input_buffer->length));
                    lVar10 = lVar10 + 1) {
                  bVar11 = puVar2[lVar10 + input_buffer->offset];
                  uVar12 = bVar11 - 0x2b;
                  if ((0x3a < uVar12) ||
                     (((0x400000004007fe5U >> ((ulong)uVar12 & 0x3f) & 1) == 0 &&
                      (bVar11 = bVar5, (ulong)uVar12 != 3)))) break;
                  local_78[lVar10] = bVar11;
                }
                local_78[lVar10] = 0;
                dVar15 = strtod((char *)local_78,(char **)&after_end);
                if (local_78 != after_end) {
                  item->valuedouble = dVar15;
                  iVar6 = 0x7fffffff;
                  if ((dVar15 < 2147483647.0) && (iVar6 = -0x80000000, -2147483648.0 < dVar15)) {
                    iVar6 = (int)dVar15;
                  }
                  item->valueint = iVar6;
                  item->type = 8;
                  input_buffer->offset =
                       (size_t)(after_end + (input_buffer->offset - (long)local_78));
                  goto LAB_00103874;
                }
              }
            }
            else if (uVar1 == '{') {
              if ((input_buffer->depth < 1000) &&
                 (input_buffer->depth = input_buffer->depth + 1, puVar2[uVar4] == '{')) {
                input_buffer->offset = uVar4 + 1;
                buffer_skip_whitespace(input_buffer);
                uVar9 = input_buffer->offset;
                if (input_buffer->length <= uVar9) goto LAB_001039dc;
                if (input_buffer->content[uVar9] == '}') {
                  item_00 = (cJSON *)0x0;
                  pcVar8 = (cJSON *)0x0;
                }
                else {
                  input_buffer->offset = uVar9 - 1;
                  pcVar13 = (cJSON *)0x0;
                  pcVar14 = (cJSON *)0x0;
                  do {
                    pcVar8 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
                    if (pcVar8 == (cJSON *)0x0) goto LAB_00103ba8;
                    pcVar8->valuedouble = 0.0;
                    pcVar8->string = (char *)0x0;
                    pcVar8->valuestring = (char *)0x0;
                    *(undefined8 *)&pcVar8->valueint = 0;
                    pcVar8->child = (cJSON *)0x0;
                    *(undefined8 *)&pcVar8->type = 0;
                    pcVar8->next = (cJSON *)0x0;
                    pcVar8->prev = (cJSON *)0x0;
                    item_00 = pcVar8;
                    if (pcVar13 != (cJSON *)0x0) {
                      pcVar14->next = pcVar8;
                      pcVar8->prev = pcVar14;
                      item_00 = pcVar13;
                    }
                    uVar9 = input_buffer->offset + 1;
                    if (input_buffer->length <= uVar9) goto LAB_00103b7f;
                    input_buffer->offset = uVar9;
                    buffer_skip_whitespace(input_buffer);
                    cVar7 = parse_string(pcVar8,input_buffer);
                    if (cVar7 == 0) goto LAB_00103b7f;
                    buffer_skip_whitespace(input_buffer);
                    pcVar8->string = pcVar8->valuestring;
                    pcVar8->valuestring = (char *)0x0;
                    uVar9 = input_buffer->offset;
                    if ((input_buffer->length <= uVar9) || (input_buffer->content[uVar9] != ':'))
                    goto LAB_00103b7f;
                    input_buffer->offset = uVar9 + 1;
                    buffer_skip_whitespace(input_buffer);
                    cVar7 = parse_value(pcVar8,input_buffer);
                    if (cVar7 == 0) goto LAB_00103b7f;
                    buffer_skip_whitespace(input_buffer);
                    uVar9 = input_buffer->offset;
                    if (input_buffer->length <= uVar9) goto LAB_00103b7f;
                    pcVar13 = item_00;
                    pcVar14 = pcVar8;
                  } while (input_buffer->content[uVar9] == ',');
                  if (input_buffer->content[uVar9] != '}') goto LAB_00103b7f;
                }
                input_buffer->depth = input_buffer->depth - 1;
                if (item_00 != (cJSON *)0x0) {
                  item_00->prev = pcVar8;
                }
                item->type = 0x40;
LAB_001039cc:
                item->child = item_00;
                input_buffer->offset = uVar9 + 1;
                goto LAB_00103874;
              }
            }
            else if (((uVar1 == '[') && (input_buffer->depth < 1000)) &&
                    (input_buffer->depth = input_buffer->depth + 1, puVar2[uVar4] == '[')) {
              input_buffer->offset = uVar4 + 1;
              buffer_skip_whitespace(input_buffer);
              uVar9 = input_buffer->offset;
              if (uVar9 < input_buffer->length) {
                if (input_buffer->content[uVar9] == ']') {
                  item_00 = (cJSON *)0x0;
                  pcVar8 = (cJSON *)0x0;
                }
                else {
                  input_buffer->offset = uVar9 - 1;
                  pcVar13 = (cJSON *)0x0;
                  pcVar14 = (cJSON *)0x0;
                  do {
                    pcVar8 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
                    if (pcVar8 == (cJSON *)0x0) goto LAB_00103ba8;
                    pcVar8->valuedouble = 0.0;
                    pcVar8->string = (char *)0x0;
                    pcVar8->valuestring = (char *)0x0;
                    *(undefined8 *)&pcVar8->valueint = 0;
                    pcVar8->child = (cJSON *)0x0;
                    *(undefined8 *)&pcVar8->type = 0;
                    pcVar8->next = (cJSON *)0x0;
                    pcVar8->prev = (cJSON *)0x0;
                    item_00 = pcVar8;
                    if (pcVar13 != (cJSON *)0x0) {
                      pcVar14->next = pcVar8;
                      pcVar8->prev = pcVar14;
                      item_00 = pcVar13;
                    }
                    input_buffer->offset = input_buffer->offset + 1;
                    buffer_skip_whitespace(input_buffer);
                    cVar7 = parse_value(pcVar8,input_buffer);
                    if (cVar7 == 0) goto LAB_00103b7f;
                    buffer_skip_whitespace(input_buffer);
                    uVar9 = input_buffer->offset;
                    if (input_buffer->length <= uVar9) goto LAB_00103b7f;
                    pcVar13 = item_00;
                    pcVar14 = pcVar8;
                  } while (input_buffer->content[uVar9] == ',');
                  if (input_buffer->content[uVar9] != ']') {
LAB_00103b7f:
                    cJSON_Delete(item_00);
                    goto LAB_00103b87;
                  }
                }
                input_buffer->depth = input_buffer->depth - 1;
                if (item_00 != (cJSON *)0x0) {
                  item_00->prev = pcVar8;
                }
                item->type = 0x20;
                goto LAB_001039cc;
              }
LAB_001039dc:
              input_buffer->offset = uVar9 - 1;
            }
          }
LAB_00103b87:
          cVar7 = 0;
          goto LAB_00103b89;
        }
        item->type = 2;
        item->valueint = 1;
        input_buffer->offset = uVar9;
      }
      else {
        item->type = 1;
        input_buffer->offset = uVar4 + 5;
      }
    }
    else {
      item->type = 4;
      input_buffer->offset = uVar9;
    }
LAB_00103874:
    cVar7 = 1;
  }
LAB_00103b89:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cVar7;
  }
LAB_00103baf:
  __stack_chk_fail();
LAB_00103ba8:
  item_00 = pcVar13;
  if (pcVar13 != (cJSON *)0x0) goto LAB_00103b7f;
  goto LAB_00103b87;
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }

    return false;
}